

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Utils.h
# Opt level: O0

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::fixupL
          (SparseLUImpl<double,_int> *this,int n,IndexVector *perm_r,GlobalLU_t *glu)

{
  int iVar1;
  int iVar2;
  Scalar *pSVar3;
  CoeffReturnType piVar4;
  Scalar local_40;
  int nsuper;
  int nextl;
  int jstart;
  int k;
  int j;
  int i;
  int fsupc;
  GlobalLU_t *glu_local;
  IndexVector *perm_r_local;
  int n_local;
  SparseLUImpl<double,_int> *this_local;
  
  local_40 = 0;
  pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,(long)n
                     );
  iVar1 = *pSVar3;
  for (k = 0; k <= iVar1; k = k + 1) {
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,(long)k);
    nextl = *pSVar3;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                        (long)nextl);
    jstart = *pSVar3;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                        (long)nextl);
    *pSVar3 = local_40;
    for (; pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                               &glu->xlsub,(long)(nextl + 1)), jstart < *pSVar3; jstart = jstart + 1
        ) {
      pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->lsub,
                          (long)jstart);
      piVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)perm_r,
                          (long)*pSVar3);
      iVar2 = *piVar4;
      pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->lsub,
                          (long)local_40);
      *pSVar3 = iVar2;
      local_40 = local_40 + 1;
    }
    while( true ) {
      nextl = nextl + 1;
      pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,
                          (long)(k + 1));
      if (*pSVar3 <= nextl) break;
      pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                          (long)nextl);
      *pSVar3 = local_40;
    }
  }
  pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,(long)n
                     );
  *pSVar3 = local_40;
  return;
}

Assistant:

void SparseLUImpl<Scalar,Index>::fixupL(const Index n, const IndexVector& perm_r, GlobalLU_t& glu)
{
  Index fsupc, i, j, k, jstart; 
  
  Index nextl = 0; 
  Index nsuper = (glu.supno)(n); 
  
  // For each supernode 
  for (i = 0; i <= nsuper; i++)
  {
    fsupc = glu.xsup(i); 
    jstart = glu.xlsub(fsupc); 
    glu.xlsub(fsupc) = nextl; 
    for (j = jstart; j < glu.xlsub(fsupc + 1); j++)
    {
      glu.lsub(nextl) = perm_r(glu.lsub(j)); // Now indexed into P*A
      nextl++;
    }
    for (k = fsupc+1; k < glu.xsup(i+1); k++)
      glu.xlsub(k) = nextl; // other columns in supernode i
  }
  
  glu.xlsub(n) = nextl; 
}